

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distort.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  float *pfVar4;
  float *pfVar5;
  reference pvVar6;
  vector<int,_std::allocator<int>_> local_588;
  _InputArray local_568;
  allocator<char> local_549;
  string local_548 [8];
  string fn_dst;
  _InputArray local_508;
  _InputArray local_4f0;
  _OutputArray local_4d8;
  _InputArray local_4c0;
  Mat local_4a8 [8];
  Mat image_distort;
  value_type *pt;
  int x_1;
  float *ptr2;
  float *ptr1;
  undefined1 local_420 [4];
  int y_1;
  _InputArray local_408;
  _InputArray local_3f0;
  _InputArray local_3d8;
  _OutputArray local_3c0;
  _InputArray local_3a8;
  int local_390;
  int local_38c;
  int x;
  int y;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pts_distort;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pts_ud;
  Mat local_350 [8];
  Mat map_y;
  Size_<int> local_2f0;
  Mat local_2e8 [8];
  Mat map_x;
  Mat local_288 [8];
  Mat cam_mtx_ud;
  Mat local_228 [8];
  Mat R;
  undefined1 local_1c8 [8];
  anon_class_32_4_45c87820 loadParams;
  Size image_size;
  Mat dis_cef;
  undefined1 local_140 [8];
  Mat cam_mtx;
  string local_d8 [8];
  Mat image_ud;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string fn_param;
  allocator<char> local_39;
  string local_38 [8];
  string fn_image;
  char **argv_local;
  int argc_local;
  
  fn_image.field_2._8_8_ = argv;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "2. Distort: input camera params and one undistorted image, then get the distorted image."
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"undistort.png",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"params.json",&local_71);
  std::allocator<char>::~allocator(&local_71);
  if (1 < argc) {
    std::__cxx11::string::operator=(local_38,*(char **)(fn_image.field_2._8_8_ + 8));
  }
  if (2 < argc) {
    std::__cxx11::string::operator=((string *)local_70,*(char **)(fn_image.field_2._8_8_ + 0x10));
  }
  cv::imread(local_d8,(int)local_38);
  bVar1 = cv::Mat::empty();
  if ((bVar1 & 1) == 0) {
    cv::Mat::Mat((Mat *)local_140);
    cv::Mat::Mat((Mat *)&image_size);
    cv::Size_<int>::Size_((Size_<int> *)&loadParams.image_size);
    local_1c8 = (undefined1  [8])local_70;
    loadParams.fn_param = (string *)local_140;
    loadParams.cam_mtx = (Mat *)&image_size;
    loadParams.dis_cef = (Mat *)&loadParams.image_size;
    bVar2 = main::anon_class_32_4_45c87820::operator()((anon_class_32_4_45c87820 *)local_1c8);
    if (bVar2) {
      cv::Mat::Mat(local_228);
      cv::Mat::clone();
      cv::Size_<int>::Size_(&local_2f0,(Size_<int> *)&loadParams.image_size);
      cv::Mat::Mat(local_2e8,&local_2f0,5);
      cv::Size_<int>::Size_
                ((Size_<int> *)
                 &pts_ud.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Size_<int> *)&loadParams.image_size);
      cv::Mat::Mat(local_350,
                   &pts_ud.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,5);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pts_distort.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&x);
      for (local_38c = 0; local_38c < loadParams.image_size._4_4_; local_38c = local_38c + 1) {
        for (local_390 = 0; local_390 < (int)loadParams.image_size; local_390 = local_390 + 1) {
          std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<int&,int&>
                    ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&x,&local_390,
                     &local_38c);
        }
      }
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_3a8,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&x);
      cv::_OutputArray::_OutputArray<cv::Point_<float>>
                (&local_3c0,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pts_distort.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      cv::_InputArray::_InputArray(&local_3d8,(Mat *)local_140);
      cv::_InputArray::_InputArray(&local_3f0,(Mat *)&image_size);
      cv::_InputArray::_InputArray(&local_408,local_228);
      cv::_InputArray::_InputArray((_InputArray *)local_420,local_288);
      cv::undistortPoints(&local_3a8,&local_3c0,&local_3d8,&local_3f0,&local_408,
                          (_InputArray *)local_420);
      cv::_InputArray::~_InputArray((_InputArray *)local_420);
      cv::_InputArray::~_InputArray(&local_408);
      cv::_InputArray::~_InputArray(&local_3f0);
      cv::_InputArray::~_InputArray(&local_3d8);
      cv::_OutputArray::~_OutputArray(&local_3c0);
      cv::_InputArray::~_InputArray(&local_3a8);
      for (ptr1._4_4_ = 0; ptr1._4_4_ < loadParams.image_size._4_4_; ptr1._4_4_ = ptr1._4_4_ + 1) {
        pfVar4 = cv::Mat::ptr<float>(local_2e8,ptr1._4_4_);
        pfVar5 = cv::Mat::ptr<float>(local_350,ptr1._4_4_);
        for (pt._4_4_ = 0; pt._4_4_ < (int)loadParams.image_size; pt._4_4_ = pt._4_4_ + 1) {
          pvVar6 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                             ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                              &pts_distort.
                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)(ptr1._4_4_ * (int)loadParams.image_size + pt._4_4_));
          pfVar4[pt._4_4_] = pvVar6->x;
          pfVar5[pt._4_4_] = pvVar6->y;
        }
      }
      cv::Mat::Mat(local_4a8);
      cv::_InputArray::_InputArray(&local_4c0,(Mat *)local_d8);
      cv::_OutputArray::_OutputArray(&local_4d8,local_4a8);
      cv::_InputArray::_InputArray(&local_4f0,local_2e8);
      cv::_InputArray::_InputArray(&local_508,local_350);
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)((long)&fn_dst.field_2 + 8));
      cv::remap(&local_4c0,&local_4d8,&local_4f0,&local_508,1,0,
                (Scalar_ *)(fn_dst.field_2._M_local_buf + 8));
      cv::_InputArray::~_InputArray(&local_508);
      cv::_InputArray::~_InputArray(&local_4f0);
      cv::_OutputArray::~_OutputArray(&local_4d8);
      cv::_InputArray::~_InputArray(&local_4c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_548,"distort.png",&local_549);
      std::allocator<char>::~allocator(&local_549);
      cv::_InputArray::_InputArray(&local_568,local_4a8);
      local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_588);
      cv::imwrite(local_548,&local_568,(vector *)&local_588);
      std::vector<int,_std::allocator<int>_>::~vector(&local_588);
      cv::_InputArray::~_InputArray(&local_568);
      poVar3 = std::operator<<((ostream *)&std::cout,"image saved to ");
      poVar3 = std::operator<<(poVar3,local_548);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_548);
      cv::Mat::~Mat(local_4a8);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&x);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pts_distort.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      cv::Mat::~Mat(local_350);
      cv::Mat::~Mat(local_2e8);
      cv::Mat::~Mat(local_288);
      cv::Mat::~Mat(local_228);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"cannot load camera params from ");
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    cv::Mat::~Mat((Mat *)&image_size);
    cv::Mat::~Mat((Mat *)local_140);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"cannot load image: ");
    poVar3 = std::operator<<(poVar3,local_38);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  cv::Mat::~Mat((Mat *)local_d8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    cout << "2. Distort: input camera params and one undistorted image, then get the distorted image." << endl;

    string fn_image = "undistort.png";
    string fn_param = "params.json";
    if (argc > 1)
        fn_image = argv[1];
    if (argc > 2)
        fn_param = argv[2];
    Mat image_ud = imread(fn_image, IMREAD_GRAYSCALE);
    if (image_ud.empty()) {
        cout << "cannot load image: " << fn_image << endl;
        return 0;
    }
    Mat cam_mtx, dis_cef;
    Size image_size;
    auto loadParams = [&]() {
        FileStorage fs;
        if (!fs.open(fn_param, FileStorage::READ))
            return false;
        fs["cam_mtx"] >> cam_mtx;
        fs["dis_cef"] >> dis_cef;
        fs["image_size"] >> image_size;
        return !cam_mtx.empty() && !dis_cef.empty() && image_size.area() > 0;
    };
    if (!loadParams()) {
        cout << "cannot load camera params from " << fn_param << endl;
        return 0;
    }

    Mat R;
    Mat cam_mtx_ud = cam_mtx.clone();

    // add distortion
    Mat map_x = Mat(image_size, CV_32FC1);
    Mat map_y = Mat(image_size, CV_32FC1);
    vector<Point2f> pts_ud, pts_distort;
    for (int y = 0; y < image_size.height; ++y)
        for (int x = 0; x < image_size.width; ++x)
            pts_distort.emplace_back(x, y);
    undistortPoints(pts_distort, pts_ud, cam_mtx, dis_cef, R, cam_mtx_ud);
    for (int y = 0; y < image_size.height; ++y) {
        float* ptr1 = map_x.ptr<float>(y);
        float* ptr2 = map_y.ptr<float>(y);
        for (int x = 0; x < image_size.width; ++x) {
            const auto& pt = pts_ud[y * image_size.width + x];
            ptr1[x] = pt.x;
            ptr2[x] = pt.y;
        }
    }
    Mat image_distort;
    remap(image_ud, image_distort, map_x, map_y, INTER_LINEAR);

    string fn_dst = "distort.png";
    imwrite(fn_dst, image_distort);
    cout << "image saved to " << fn_dst << endl;

    return 0;
}